

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O3

int DecodeImageData(VP8LDecoder *dec,uint32_t *data,int width,int height,int last_row,
                   ProcessRowsFunc process_func)

{
  VP8LBitReader *br;
  VP8LColorCache *src;
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  uint32_t *puVar5;
  uint32_t *puVar6;
  ulong uVar7;
  vp8l_val_t vVar8;
  uint8_t *puVar9;
  size_t sVar10;
  uint uVar11;
  uint32_t uVar12;
  uint uVar13;
  byte bVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  uint32_t *puVar18;
  ulong uVar19;
  HuffmanCode *pHVar20;
  uint32_t *puVar21;
  uint32_t *puVar22;
  int iVar23;
  uint uVar24;
  uint32_t uVar25;
  ulong uVar26;
  VP8LColorCache *pVVar27;
  bool bVar28;
  HTreeGroup *local_80;
  int local_6c;
  
  iVar15 = dec->last_pixel_;
  uVar19 = (long)iVar15 / (long)width;
  uVar7 = (long)iVar15 % (long)width;
  uVar26 = uVar19 & 0xffffffff;
  iVar23 = (int)uVar19;
  uVar19 = uVar7 & 0xffffffff;
  br = &dec->br_;
  iVar3 = (dec->hdr_).color_cache_size_;
  local_6c = 0x1000000;
  if (dec->incremental_ != 0) {
    local_6c = iVar23;
  }
  src = &(dec->hdr_).color_cache_;
  pVVar27 = (VP8LColorCache *)0x0;
  if (0 < iVar3) {
    pVVar27 = src;
  }
  puVar18 = data + iVar15;
  if (iVar15 < last_row * width) {
    iVar15 = (dec->hdr_).huffman_subsample_bits_;
    if (iVar15 == 0) {
      lVar17 = 0;
    }
    else {
      bVar14 = (byte)iVar15;
      lVar17 = (long)(int)(dec->hdr_).huffman_image_
                          [((int)uVar7 >> (bVar14 & 0x1f)) +
                           (iVar23 >> (bVar14 & 0x1f)) * (dec->hdr_).huffman_xsize_];
    }
    uVar13 = (dec->hdr_).huffman_mask_;
    local_80 = (dec->hdr_).htree_groups_ + lVar17;
    puVar22 = puVar18;
    do {
      iVar23 = (int)uVar26;
      if (local_6c <= iVar23) {
        iVar15 = (dec->br_).eos_;
        (dec->saved_br_).bit_pos_ = (dec->br_).bit_pos_;
        (dec->saved_br_).eos_ = iVar15;
        vVar8 = br->val_;
        puVar9 = (dec->br_).buf_;
        sVar10 = (dec->br_).pos_;
        (dec->saved_br_).len_ = (dec->br_).len_;
        (dec->saved_br_).pos_ = sVar10;
        (dec->saved_br_).val_ = vVar8;
        (dec->saved_br_).buf_ = puVar9;
        dec->saved_last_pixel_ = (int)((ulong)((long)puVar18 - (long)data) >> 2);
        if (0 < (dec->hdr_).color_cache_size_) {
          VP8LColorCacheCopy(src,&(dec->hdr_).saved_color_cache_);
        }
        local_6c = iVar23 + 8;
      }
      uVar24 = (uint)uVar19;
      if ((uVar13 & uVar24) == 0) {
        iVar15 = (dec->hdr_).huffman_subsample_bits_;
        if (iVar15 == 0) {
          lVar17 = 0;
        }
        else {
          bVar14 = (byte)iVar15;
          lVar17 = (long)(int)(dec->hdr_).huffman_image_
                              [((int)uVar24 >> (bVar14 & 0x1f)) +
                               (iVar23 >> (bVar14 & 0x1f)) * (dec->hdr_).huffman_xsize_];
        }
        local_80 = (dec->hdr_).htree_groups_ + lVar17;
      }
      if (local_80->is_trivial_code != 0) {
        uVar25 = local_80->literal_arb;
        goto LAB_00111007;
      }
      if (0x1f < (dec->br_).bit_pos_) {
        VP8LDoFillBitWindow(br);
      }
      if (local_80->use_packed_table == 0) {
        uVar19 = (dec->br_).val_;
        iVar15 = (dec->br_).bit_pos_;
        pHVar20 = local_80->htrees[0] + (uVar19 >> ((byte)iVar15 & 0x3f) & 0xff);
        bVar14 = pHVar20->bits;
        if (8 < bVar14) {
          iVar15 = iVar15 + 8;
          pHVar20 = pHVar20 + (ulong)pHVar20->value +
                              (ulong)(~(-1 << (bVar14 - 8 & 0x1f)) &
                                     (uint)(uVar19 >> ((byte)iVar15 & 0x3f)));
          bVar14 = pHVar20->bits;
        }
        (dec->br_).bit_pos_ = (uint)bVar14 + iVar15;
        if ((dec->br_).eos_ != 0) break;
        uVar25 = (uint32_t)pHVar20->value;
LAB_00111191:
        if (((dec->br_).pos_ == (dec->br_).len_) && (0x40 < (dec->br_).bit_pos_)) break;
        if ((int)uVar25 < 0x100) {
          if (local_80->is_trivial_literal == 0) {
            iVar15 = (dec->br_).bit_pos_;
            pHVar20 = local_80->htrees[1] + (uVar19 >> ((byte)iVar15 & 0x3f) & 0xff);
            bVar14 = pHVar20->bits;
            if (8 < bVar14) {
              iVar15 = iVar15 + 8;
              pHVar20 = pHVar20 + (ulong)pHVar20->value +
                                  (ulong)(~(-1 << (bVar14 - 8 & 0x1f)) &
                                         (uint)(uVar19 >> ((byte)iVar15 & 0x3f)));
              bVar14 = pHVar20->bits;
            }
            iVar15 = (uint)bVar14 + iVar15;
            (dec->br_).bit_pos_ = iVar15;
            uVar1 = pHVar20->value;
            if (0x1f < iVar15) {
              VP8LDoFillBitWindow(br);
              uVar19 = (dec->br_).val_;
              iVar15 = (dec->br_).bit_pos_;
            }
            pHVar20 = local_80->htrees[2] + (uVar19 >> ((byte)iVar15 & 0x3f) & 0xff);
            bVar14 = pHVar20->bits;
            if (8 < bVar14) {
              iVar15 = iVar15 + 8;
              pHVar20 = pHVar20 + (ulong)pHVar20->value +
                                  (ulong)(~(-1 << (bVar14 - 8 & 0x1f)) &
                                         (uint)(uVar19 >> ((byte)iVar15 & 0x3f)));
              bVar14 = pHVar20->bits;
            }
            iVar15 = (uint)bVar14 + iVar15;
            uVar2 = pHVar20->value;
            pHVar20 = local_80->htrees[3] + (uVar19 >> ((byte)iVar15 & 0x3f) & 0xff);
            bVar14 = pHVar20->bits;
            if (8 < bVar14) {
              iVar15 = iVar15 + 8;
              pHVar20 = pHVar20 + (ulong)pHVar20->value +
                                  (ulong)(~(-1 << (bVar14 - 8 & 0x1f)) &
                                         (uint)(uVar19 >> ((byte)iVar15 & 0x3f)));
              bVar14 = pHVar20->bits;
            }
            (dec->br_).bit_pos_ = (uint)bVar14 + iVar15;
            if (((dec->br_).eos_ != 0) ||
               (((dec->br_).pos_ == (dec->br_).len_ && (0x40 < (int)((uint)bVar14 + iVar15)))))
            break;
            uVar25 = uVar25 << 8 | (uint)uVar1 << 0x10 | (uint)uVar2 | (uint)pHVar20->value << 0x18;
          }
          else {
            uVar25 = uVar25 << 8 | local_80->literal_arb;
          }
LAB_00111007:
          *puVar18 = uVar25;
          goto LAB_0011100a;
        }
        if (0x117 < uVar25) {
          if ((int)uVar25 < iVar3 + 0x118) {
            puVar6 = src->colors_;
            for (; puVar22 < puVar18; puVar22 = puVar22 + 1) {
              puVar6[(int)(*puVar22 * 0x1e35a7bd >> ((byte)pVVar27->hash_shift_ & 0x1f))] = *puVar22
              ;
            }
            uVar25 = puVar6[(ulong)uVar25 - 0x118];
            goto LAB_00111007;
          }
          goto LAB_001116ab;
        }
        uVar11 = uVar25 - 0x100;
        if (3 < uVar11) {
          uVar11 = uVar25 - 0x102 >> 1;
          uVar12 = VP8LReadBits(br,uVar11);
          uVar11 = uVar12 + ((uVar25 & 1 | 2) << ((byte)uVar11 & 0x1f));
          uVar19 = br->val_;
        }
        iVar15 = (dec->br_).bit_pos_;
        pHVar20 = local_80->htrees[4] + (uVar19 >> ((byte)iVar15 & 0x3f) & 0xff);
        bVar14 = pHVar20->bits;
        if (8 < bVar14) {
          iVar15 = iVar15 + 8;
          pHVar20 = pHVar20 + (ulong)pHVar20->value +
                              (ulong)(~(-1 << (bVar14 - 8 & 0x1f)) &
                                     (uint)(uVar19 >> ((byte)iVar15 & 0x3f)));
          bVar14 = pHVar20->bits;
        }
        (dec->br_).bit_pos_ = (uint)bVar14 + iVar15;
        uVar1 = pHVar20->value;
        uVar16 = (uint)uVar1;
        if (0x1f < (int)((uint)bVar14 + iVar15)) {
          VP8LDoFillBitWindow(br);
        }
        if (3 < uVar1) {
          uVar16 = uVar1 - 2 >> 1;
          uVar25 = VP8LReadBits(br,uVar16);
          uVar16 = uVar25 + ((uVar1 & 1 | 2) << ((byte)uVar16 & 0x1f));
        }
        if ((int)(uVar16 + 1) < 0x79) {
          uVar16 = ((uint)("\x18\a\x17\x19(\x06\')\x16\x1a&*8\x0579\x15\x1b6:%+H\x04GI\x14\x1c5;FJ$,XEK4<\x03WY\x13\x1dVZ#-DLU[3=h\x02gi\x12\x1efj\".T\\CMek2>x\x01wyS]\x11\x1fdlBNvz!/u{1?cmR^"
                           [(int)uVar16] >> 4) * width -
                   ("\x18\a\x17\x19(\x06\')\x16\x1a&*8\x0579\x15\x1b6:%+H\x04GI\x14\x1c5;FJ$,XEK4<\x03WY\x13\x1dVZ#-DLU[3=h\x02gi\x12\x1efj\".T\\CMek2>x\x01wyS]\x11\x1fdlBNvz!/u{1?cmR^"
                    [(int)uVar16] & 0xf)) + 8;
          if ((int)uVar16 < 2) {
            uVar16 = 1;
          }
        }
        else {
          uVar16 = uVar16 - 0x77;
        }
        if (((dec->br_).eos_ != 0) ||
           (((dec->br_).pos_ == (dec->br_).len_ && (0x40 < (dec->br_).bit_pos_)))) break;
        if ((long)puVar18 - (long)data >> 2 < (long)(ulong)uVar16) goto LAB_001116ab;
        iVar15 = uVar11 + 1;
        if ((long)(data + height * width) - (long)puVar18 >> 2 < (long)iVar15) goto LAB_001116ab;
        CopyBlock32b(puVar18,uVar16,iVar15);
        uVar24 = uVar24 + iVar15;
        while( true ) {
          uVar19 = (ulong)uVar24;
          iVar23 = (int)uVar26;
          if ((int)uVar24 < width) break;
          uVar11 = iVar23 + 1;
          uVar26 = (ulong)uVar11;
          if ((uVar11 & 0xf) == 0 && (iVar23 < last_row && process_func != (ProcessRowsFunc)0x0)) {
            (*process_func)(dec,uVar11);
          }
          uVar24 = uVar24 - width;
        }
        if ((uVar13 & uVar24) != 0) {
          iVar4 = (dec->hdr_).huffman_subsample_bits_;
          if (iVar4 == 0) {
            lVar17 = 0;
          }
          else {
            bVar14 = (byte)iVar4;
            lVar17 = (long)(int)(dec->hdr_).huffman_image_
                                [((int)uVar24 >> (bVar14 & 0x1f)) +
                                 (iVar23 >> (bVar14 & 0x1f)) * (dec->hdr_).huffman_xsize_];
          }
          local_80 = (dec->hdr_).htree_groups_ + lVar17;
        }
        puVar6 = puVar18 + iVar15;
        if ((0 < iVar3) && (puVar22 < puVar6)) {
          puVar18 = src->colors_;
          do {
            uVar25 = *puVar22;
            puVar22 = puVar22 + 1;
            puVar18[(int)(uVar25 * 0x1e35a7bd >> ((byte)pVVar27->hash_shift_ & 0x1f))] = uVar25;
          } while (puVar22 < puVar6);
        }
      }
      else {
        uVar19 = (dec->br_).val_;
        iVar15 = (dec->br_).bit_pos_;
        uVar11 = (uint)(uVar19 >> ((byte)iVar15 & 0x3f)) & 0x3f;
        iVar4 = local_80->packed_table[uVar11].bits;
        uVar25 = local_80->packed_table[uVar11].value;
        iVar15 = iVar15 + iVar4;
        if (iVar4 < 0x100) {
          (dec->br_).bit_pos_ = iVar15;
          *puVar18 = uVar25;
          uVar25 = 0;
        }
        else {
          (dec->br_).bit_pos_ = iVar15 + -0x100;
        }
        if (((dec->br_).eos_ != 0) ||
           (((dec->br_).pos_ == (dec->br_).len_ && (0x40 < (dec->br_).bit_pos_)))) break;
        if (uVar25 != 0) goto LAB_00111191;
LAB_0011100a:
        puVar6 = puVar18 + 1;
        uVar19 = (ulong)(uVar24 + 1);
        if (width <= (int)(uVar24 + 1)) {
          uVar24 = iVar23 + 1;
          uVar26 = (ulong)uVar24;
          if ((uVar24 & 0xf) == 0 && (iVar23 < last_row && process_func != (ProcessRowsFunc)0x0)) {
            (*process_func)(dec,uVar24);
          }
          uVar19 = 0;
          if ((0 < iVar3) && (puVar22 < puVar6)) {
            puVar5 = src->colors_;
            puVar21 = puVar22;
            do {
              puVar22 = puVar21 + 1;
              puVar5[(int)(*puVar21 * 0x1e35a7bd >> ((byte)pVVar27->hash_shift_ & 0x1f))] = *puVar21
              ;
              bVar28 = puVar21 < puVar18;
              uVar19 = 0;
              puVar21 = puVar22;
            } while (bVar28);
          }
        }
      }
      puVar18 = puVar6;
      iVar23 = (int)uVar26;
    } while (puVar18 < data + last_row * width);
  }
  uVar13 = 1;
  if (((dec->br_).eos_ == 0) && (uVar13 = 0, (dec->br_).pos_ == (dec->br_).len_)) {
    uVar13 = (uint)(0x40 < (dec->br_).bit_pos_);
  }
  (dec->br_).eos_ = uVar13;
  if (((dec->incremental_ == 0) || (uVar13 == 0)) || (data + height * width <= puVar18)) {
    if (uVar13 == 0) {
      if (process_func != (ProcessRowsFunc)0x0) {
        if (iVar23 < last_row) {
          last_row = iVar23;
        }
        (*process_func)(dec,last_row);
      }
      dec->status_ = VP8_STATUS_OK;
      dec->last_pixel_ = (int)((ulong)((long)puVar18 - (long)data) >> 2);
      iVar15 = 1;
    }
    else {
LAB_001116ab:
      dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
      iVar15 = 0;
    }
  }
  else {
    dec->status_ = VP8_STATUS_SUSPENDED;
    iVar15 = (dec->saved_br_).eos_;
    (dec->br_).bit_pos_ = (dec->saved_br_).bit_pos_;
    (dec->br_).eos_ = iVar15;
    vVar8 = (dec->saved_br_).val_;
    puVar9 = (dec->saved_br_).buf_;
    sVar10 = (dec->saved_br_).pos_;
    (dec->br_).len_ = (dec->saved_br_).len_;
    (dec->br_).pos_ = sVar10;
    br->val_ = vVar8;
    (dec->br_).buf_ = puVar9;
    dec->last_pixel_ = dec->saved_last_pixel_;
    iVar15 = 1;
    if (0 < (dec->hdr_).color_cache_size_) {
      VP8LColorCacheCopy(&(dec->hdr_).saved_color_cache_,src);
    }
  }
  return iVar15;
}

Assistant:

static int DecodeImageData(VP8LDecoder* const dec, uint32_t* const data,
                           int width, int height, int last_row,
                           ProcessRowsFunc process_func) {
  int row = dec->last_pixel_ / width;
  int col = dec->last_pixel_ % width;
  VP8LBitReader* const br = &dec->br_;
  VP8LMetadata* const hdr = &dec->hdr_;
  uint32_t* src = data + dec->last_pixel_;
  uint32_t* last_cached = src;
  uint32_t* const src_end = data + width * height;     // End of data
  uint32_t* const src_last = data + width * last_row;  // Last pixel to decode
  const int len_code_limit = NUM_LITERAL_CODES + NUM_LENGTH_CODES;
  const int color_cache_limit = len_code_limit + hdr->color_cache_size_;
  int next_sync_row = dec->incremental_ ? row : 1 << 24;
  VP8LColorCache* const color_cache =
      (hdr->color_cache_size_ > 0) ? &hdr->color_cache_ : NULL;
  const int mask = hdr->huffman_mask_;
  const HTreeGroup* htree_group =
      (src < src_last) ? GetHtreeGroupForPos(hdr, col, row) : NULL;
  assert(dec->last_row_ < last_row);
  assert(src_last <= src_end);

  while (src < src_last) {
    int code;
    if (row >= next_sync_row) {
      SaveState(dec, (int)(src - data));
      next_sync_row = row + SYNC_EVERY_N_ROWS;
    }
    // Only update when changing tile. Note we could use this test:
    // if "((((prev_col ^ col) | prev_row ^ row)) > mask)" -> tile changed
    // but that's actually slower and needs storing the previous col/row.
    if ((col & mask) == 0) {
      htree_group = GetHtreeGroupForPos(hdr, col, row);
    }
    assert(htree_group != NULL);
    if (htree_group->is_trivial_code) {
      *src = htree_group->literal_arb;
      goto AdvanceByOne;
    }
    VP8LFillBitWindow(br);
    if (htree_group->use_packed_table) {
      code = ReadPackedSymbols(htree_group, br, src);
      if (VP8LIsEndOfStream(br)) break;
      if (code == PACKED_NON_LITERAL_CODE) goto AdvanceByOne;
    } else {
      code = ReadSymbol(htree_group->htrees[GREEN], br);
    }
    if (VP8LIsEndOfStream(br)) break;
    if (code < NUM_LITERAL_CODES) {  // Literal
      if (htree_group->is_trivial_literal) {
        *src = htree_group->literal_arb | (code << 8);
      } else {
        int red, blue, alpha;
        red = ReadSymbol(htree_group->htrees[RED], br);
        VP8LFillBitWindow(br);
        blue = ReadSymbol(htree_group->htrees[BLUE], br);
        alpha = ReadSymbol(htree_group->htrees[ALPHA], br);
        if (VP8LIsEndOfStream(br)) break;
        *src = ((uint32_t)alpha << 24) | (red << 16) | (code << 8) | blue;
      }
    AdvanceByOne:
      ++src;
      ++col;
      if (col >= width) {
        col = 0;
        ++row;
        if (process_func != NULL) {
          if (row <= last_row && (row % NUM_ARGB_CACHE_ROWS == 0)) {
            process_func(dec, row);
          }
        }
        if (color_cache != NULL) {
          while (last_cached < src) {
            VP8LColorCacheInsert(color_cache, *last_cached++);
          }
        }
      }
    } else if (code < len_code_limit) {  // Backward reference
      int dist_code, dist;
      const int length_sym = code - NUM_LITERAL_CODES;
      const int length = GetCopyLength(length_sym, br);
      const int dist_symbol = ReadSymbol(htree_group->htrees[DIST], br);
      VP8LFillBitWindow(br);
      dist_code = GetCopyDistance(dist_symbol, br);
      dist = PlaneCodeToDistance(width, dist_code);

      if (VP8LIsEndOfStream(br)) break;
      if (src - data < (ptrdiff_t)dist || src_end - src < (ptrdiff_t)length) {
        goto Error;
      } else {
        CopyBlock32b(src, dist, length);
      }
      src += length;
      col += length;
      while (col >= width) {
        col -= width;
        ++row;
        if (process_func != NULL) {
          if (row <= last_row && (row % NUM_ARGB_CACHE_ROWS == 0)) {
            process_func(dec, row);
          }
        }
      }
      // Because of the check done above (before 'src' was incremented by
      // 'length'), the following holds true.
      assert(src <= src_end);
      if (col & mask) htree_group = GetHtreeGroupForPos(hdr, col, row);
      if (color_cache != NULL) {
        while (last_cached < src) {
          VP8LColorCacheInsert(color_cache, *last_cached++);
        }
      }
    } else if (code < color_cache_limit) {  // Color cache
      const int key = code - len_code_limit;
      assert(color_cache != NULL);
      while (last_cached < src) {
        VP8LColorCacheInsert(color_cache, *last_cached++);
      }
      *src = VP8LColorCacheLookup(color_cache, key);
      goto AdvanceByOne;
    } else {  // Not reached
      goto Error;
    }
  }

  br->eos_ = VP8LIsEndOfStream(br);
  if (dec->incremental_ && br->eos_ && src < src_end) {
    RestoreState(dec);
  } else if (!br->eos_) {
    // Process the remaining rows corresponding to last row-block.
    if (process_func != NULL) {
      process_func(dec, row > last_row ? last_row : row);
    }
    dec->status_ = VP8_STATUS_OK;
    dec->last_pixel_ = (int)(src - data);  // end-of-scan marker
  } else {
    // if not incremental, and we are past the end of buffer (eos_=1), then this
    // is a real bitstream error.
    goto Error;
  }
  return 1;

 Error:
  dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
  return 0;
}